

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

void dropy(obj *obj)

{
  boolean bVar1;
  int iVar2;
  permonst *mdat;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool local_13;
  boolean could_heal;
  boolean could_grow;
  boolean could_slime;
  boolean could_poly;
  boolean could_petrify;
  obj *obj_local;
  
  if (obj == uwep) {
    setuwep((obj *)0x0);
  }
  if (obj == uquiver) {
    setuqwep((obj *)0x0);
  }
  if (obj == uswapwep) {
    setuswapwep((obj *)0x0);
  }
  if (((u._1052_1_ & 1) != 0) ||
     (bVar1 = flooreffects(obj,(int)u.ux,(int)u.uy,"drop"), bVar1 == '\0')) {
    if ((u._1052_1_ & 1) == 0) {
      place_object(obj,level,(int)u.ux,(int)u.uy);
      if (obj == uball) {
        drop_ball(u.ux,u.uy,'\0','\0');
      }
      else {
        sellobj(obj,u.ux,u.uy);
      }
      stackobj(obj);
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
         ((u.uprops[0x12].intrinsic != 0 ||
          ((u.uprops[0x12].extrinsic != 0 || ((youmonst.data)->mlet == '\x05')))))) {
        map_object(obj,0);
      }
      newsym((int)u.ux,(int)u.uy);
    }
    else {
      bVar3 = false;
      bVar4 = false;
      local_13 = false;
      bVar5 = false;
      bVar6 = false;
      if (obj != uball) {
        if (obj->otyp == 0x10e) {
          bVar3 = true;
          if (((long)obj->corpsenm & 0x3ffffffffffffffU) != 0xc) {
            bVar3 = ((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xb;
          }
          if (((obj->otyp == 0x10e) || (obj->otyp == 0x10f)) || (bVar4 = false, obj->otyp == 0x129))
          {
            iVar2 = pm_to_cham(obj->corpsenm);
            bVar4 = iVar2 != 0;
          }
          local_13 = obj->corpsenm == 0xd7;
          bVar5 = obj->corpsenm == 0xec;
          bVar6 = obj->corpsenm == 0x119;
        }
        mpickobj(u.ustuck,obj);
        if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
          if ((bVar4) || (local_13 != false)) {
            mdat = mons + 0xd7;
            if (bVar4) {
              mdat = (permonst *)0x0;
            }
            newcham(level,u.ustuck,mdat,'\0',local_13);
            delobj(obj);
          }
          else if (bVar3) {
            minstapetrify(u.ustuck,'\x01');
            if ((u._1052_1_ & 1) == 0) {
              delobj(obj);
            }
          }
          else if (bVar5) {
            grow_up(u.ustuck,(monst *)0x0);
            delobj(obj);
          }
          else if (bVar6) {
            (u.ustuck)->mhp = (u.ustuck)->mhpmax;
            delobj(obj);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dropy(struct obj *obj)
{
	if (obj == uwep) setuwep(NULL);
	if (obj == uquiver) setuqwep(NULL);
	if (obj == uswapwep) setuswapwep(NULL);

	if (!u.uswallow && flooreffects(obj,u.ux,u.uy,"drop")) return;
	/* uswallow check done by GAN 01/29/87 */
	if (u.uswallow) {
	    boolean could_petrify = FALSE;
	    boolean could_poly = FALSE;
	    boolean could_slime = FALSE;
	    boolean could_grow = FALSE;
	    boolean could_heal = FALSE;

	    if (obj != uball) {		/* mon doesn't pick up ball */
		if (obj->otyp == CORPSE) {
		    could_petrify = touch_petrifies(&mons[obj->corpsenm]);
		    could_poly = polyfodder(obj);
		    could_slime = (obj->corpsenm == PM_GREEN_SLIME);
		    could_grow = (obj->corpsenm == PM_WRAITH);
		    could_heal = (obj->corpsenm == PM_NURSE);
		}
		mpickobj(u.ustuck,obj);
		if (is_animal(u.ustuck->data)) {
		    if (could_poly || could_slime) {
			newcham(level, u.ustuck,
				       could_poly ? NULL :
				       &mons[PM_GREEN_SLIME],
				       FALSE, could_slime);
			delobj(obj);	/* corpse is digested */
		    } else if (could_petrify) {
			minstapetrify(u.ustuck, TRUE);
			/* Don't leave a cockatrice corpse in a statue */
			if (!u.uswallow) delobj(obj);
		    } else if (could_grow) {
			grow_up(u.ustuck, NULL);
			delobj(obj);	/* corpse is digested */
		    } else if (could_heal) {
			u.ustuck->mhp = u.ustuck->mhpmax;
			delobj(obj);	/* corpse is digested */
		    }
		}
	    }
	} else  {
	    place_object(obj, level, u.ux, u.uy);
	    if (obj == uball)
		drop_ball(u.ux, u.uy, 0, 0);
	    else
		sellobj(obj, u.ux, u.uy);
	    stackobj(obj);
	    if (Blind && Levitation)
		map_object(obj, 0);
	    newsym(u.ux, u.uy);	/* remap location under self */
	}
}